

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::(anonymous_namespace)::ToCIdent_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view str)

{
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  pStack_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  s._M_len = str._M_len;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&pStack_88,(char (*) [2])0x2d57d4,(char (*) [2])0x365a31);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_68,(char (*) [2])0x342490,(char (*) [2])0x365a31);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_48,(char (*) [2])0x38283b,(char (*) [2])0x365a31);
  s._M_str = (char *)&pStack_88;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)this,s,replacements);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCIdent(absl::string_view str) {
  return absl::StrReplaceAll(str, {{".", "_"}, {"/", "_"}, {"-", "_"}});
}